

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpEndpointName.cpp
# Opt level: O0

void __thiscall IpEndpointName::AddressAsString(IpEndpointName *this,char *s)

{
  char *s_local;
  IpEndpointName *this_local;
  
  if (this->address == 0xffffffff) {
    sprintf(s,"<any>");
  }
  else {
    sprintf(s,"%d.%d.%d.%d",(ulong)((uint)(this->address >> 0x18) & 0xff),
            this->address >> 0x10 & 0xff,(ulong)((uint)(this->address >> 8) & 0xff),
            (ulong)((uint)this->address & 0xff));
  }
  return;
}

Assistant:

void IpEndpointName::AddressAsString( char *s ) const
{
	if( address == ANY_ADDRESS ){
		std::sprintf( s, "<any>" );
	}else{
		std::sprintf( s, "%d.%d.%d.%d",
				(int)((address >> 24) & 0xFF),
				(int)((address >> 16) & 0xFF),
				(int)((address >> 8) & 0xFF),
				(int)(address & 0xFF) );
	}
}